

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<ProKey,_QMakeInternal::QMakeBuiltin>::emplace_helper<QMakeInternal::QMakeBuiltin>
          (QHash<ProKey,_QMakeInternal::QMakeBuiltin> *this,ProKey *key,QMakeBuiltin *args)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  piter pVar4;
  int iVar5;
  Node<ProKey,_QMakeInternal::QMakeBuiltin> *this_00;
  long in_FS_OFFSET;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::findOrInsert<ProKey>
            ((InsertionResult *)local_48,this->d,key);
  this_00 = (Node<ProKey,_QMakeInternal::QMakeBuiltin> *)
            ((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries +
            (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
            [(uint)local_48._8_8_ & 0x7f]);
  if (local_48[0x10] == false) {
    ProString::ProString((ProString *)this_00,&key->super_ProString);
    pDVar1 = (args->usage).d.d;
    (args->usage).d.d = (Data *)0x0;
    (this_00->value).usage.d.d = pDVar1;
    pcVar2 = (args->usage).d.ptr;
    (args->usage).d.ptr = (char16_t *)0x0;
    (this_00->value).usage.d.ptr = pcVar2;
    qVar3 = (args->usage).d.size;
    (args->usage).d.size = 0;
    (this_00->value).usage.d.size = qVar3;
    iVar5 = args->minArgs;
    (this_00->value).index = args->index;
    (this_00->value).minArgs = iVar5;
    (this_00->value).maxArgs = args->maxArgs;
  }
  else {
    QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>::
    emplaceValue<QMakeInternal::QMakeBuiltin>(this_00,args);
  }
  pVar4.bucket = local_48._8_8_;
  pVar4.d = (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)local_48._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar4;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }